

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.cpp
# Opt level: O1

void vecNormalize(vec_t *vin,vec_t *vout)

{
  double dVar1;
  
  dVar1 = vin[2] * vin[2] + *vin * *vin + vin[1] * vin[1];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = 1.0 / dVar1;
    *vout = *vin * dVar1;
    vout[1] = vin[1] * dVar1;
    vout[2] = dVar1 * vin[2];
  }
  else {
    *vout = 0.0;
    vout[1] = 0.0;
    vout[2] = 0.0;
  }
  return;
}

Assistant:

void vecNormalize( const vec3_t vin, vec3_t vout ){
	vec_t length;

	length = vecLength( vin );

	if( length )
	{
		length = 1/length;

		vout[X]=vin[X]*length;
		vout[Y]=vin[Y]*length;
		vout[Z]=vin[Z]*length;
	} else 
		vecClear( vout );
}